

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
::upper_bound(base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *this,key_type *key)

{
  iterator checker_iter;
  iterator iVar1;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
  bVar2;
  iterator iVar3;
  key_type *key_local;
  base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  *this_local;
  
  iVar1 = btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>>
          ::upper_bound<std::pair<int,int>>
                    ((btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>>
                      *)this,key);
  checker_iter = std::
                 multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 ::upper_bound(&this->checker_,key);
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                *)SUB128(iVar1._0_12_,0);
  bVar2.position = SUB124(iVar1._0_12_,8);
  bVar2 = base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>,std::pair<std::pair<int,int>const,std::pair<int,int>>&,std::pair<std::pair<int,int>const,std::pair<int,int>>*>,std::_Rb_tree_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
                    ((base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
                      *)this,bVar2,
                     (_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>
                     )checker_iter._M_node);
  iVar3._12_4_ = 0;
  iVar3.node = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                *)SUB128(bVar2._0_12_,0);
  iVar3.position = SUB124(bVar2._0_12_,8);
  return iVar3;
}

Assistant:

iterator upper_bound(const key_type &key) {
        return iter_check(tree_.upper_bound(key), checker_.upper_bound(key));
    }